

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.hpp
# Opt level: O0

void re::math::normalize<float,_1l,_1l>(span<const_float,__1L> in,span<float,__1L> out)

{
  index_type iVar1;
  index_type iVar2;
  iterator iVar3;
  span_iterator<gsl::span<const_float,__1L>,_false> local_a0;
  float local_8c;
  span<float,__1L> local_88;
  span_iterator<gsl::span<float,__1L>,_false> local_78;
  span_iterator<gsl::span<const_float,__1L>,_false> local_68;
  span<const_float,__1L> local_50;
  span<const_float,__1L> local_40;
  anon_class_4_1_ba1d79ab local_2c;
  undefined1 auStack_28 [4];
  float sum;
  span<float,__1L> out_local;
  span<const_float,__1L> in_local;
  
  out_local.storage_.super_extent_type<_1L>.size_ = (index_type)out.storage_.data_;
  _auStack_28 = out.storage_.super_extent_type<_1L>.size_;
  out_local.storage_.data_ = (pointer)in.storage_.super_extent_type<_1L>.size_;
  iVar1 = ::std::size<gsl::span<float_const,_1l>>
                    ((span<const_float,__1L> *)&out_local.storage_.data_);
  iVar2 = ::std::size<gsl::span<float,_1l>>((span<float,__1L> *)auStack_28);
  if (iVar1 != iVar2) {
    __assert_fail("std::size(in) == std::size(out)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/normalize.hpp"
                  ,0x10,
                  "void re::math::normalize(gsl::span<const T, N_in>, gsl::span<T, N_out>) [T = float, N_in = -1L, N_out = -1L]"
                 );
  }
  ::std::cbegin<gsl::span<float_const,_1l>>(&local_40);
  iVar3 = ::std::cend<gsl::span<float_const,_1l>>(&local_50);
  local_2c.sum = ::std::
                 accumulate<gsl::details::span_iterator<gsl::span<float_const,_1l>,false>,float,re::math::normalize<float,_1l,_1l>(gsl::span<float_const,_1l>,gsl::span<float,_1l>)::_lambda(auto:1,auto:2)_1_>
                           (&local_40,&local_50,iVar3.index_);
  if (0.0 <= local_2c.sum) {
    ::std::cbegin<gsl::span<float_const,_1l>>((span<const_float,__1L> *)&local_68);
    ::std::cend<gsl::span<float_const,_1l>>((span<const_float,__1L> *)&local_78);
    ::std::begin<gsl::span<float,_1l>>(&local_88);
    local_8c = local_2c.sum;
    ::std::
    transform<gsl::details::span_iterator<gsl::span<float_const,_1l>,false>,gsl::details::span_iterator<gsl::span<float,_1l>,false>,re::math::normalize<float,_1l,_1l>(gsl::span<float_const,_1l>,gsl::span<float,_1l>)::_lambda(auto:1)_1_>
              (&local_a0,&local_68,&local_78,local_2c);
    return;
  }
  __assert_fail("sum >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/normalize.hpp"
                ,0x1a,
                "void re::math::normalize(gsl::span<const T, N_in>, gsl::span<T, N_out>) [T = float, N_in = -1L, N_out = -1L]"
               );
}

Assistant:

void
normalize(gsl::span<T const, N_in> in, gsl::span<T, N_out> out)
noexcept {
    assert(std::size(in) == std::size(out));
    auto sum = std::accumulate(
        std::cbegin(in),
        std::cend(in),
        static_cast<T>(0),
        [] (const auto result, const auto value) {
            return result + std::fmax(value, 0);
        }
    );

    assert(sum >= 0);
    std::transform(
        std::cbegin(in),
        std::cend(in),
        std::begin(out),
        [sum] (auto v) {
            return v / sum;
        }
    );
}